

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBucket.cpp
# Opt level: O0

void __thiscall
Memory::HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>::
AppendAllocableHeapBlockList
          (HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
           *this,SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes> *list)

{
  code *pcVar1;
  bool bVar2;
  CollectionState CVar3;
  Recycler *pRVar4;
  ConfigFlagsTable *pCVar5;
  SmallNormalHeapBlockT<MediumAllocationBlockAttributes> *this_00;
  undefined4 *puVar6;
  SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes> *tail;
  SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes> *currentHeapBlockList;
  CollectionState collectionState;
  SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes> *list_local;
  HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
  *this_local;
  
  pRVar4 = HeapBucket::GetRecycler(&this->super_HeapBucket);
  pCVar5 = Recycler::GetRecyclerFlagsTable(pRVar4);
  bVar2 = Js::Phases::IsEnabled(&pCVar5->Trace,ConcurrentSweepPhase);
  if ((bVar2) && ((DAT_01ec73ca & 1) != 0)) {
    pRVar4 = HeapBucket::GetRecycler(&this->super_HeapBucket);
    CVar3 = ObservableValue::operator_cast_to_CollectionState
                      ((ObservableValue *)&pRVar4->collectionState);
    pRVar4 = HeapBucket::GetRecycler(&this->super_HeapBucket);
    Output::Print(L"[GC #%d] [HeapBucket 0x%p] in AppendAllocableHeapBlockList [CollectionState: %d] \n"
                  ,(ulong)pRVar4->collectionCount,this,(ulong)CVar3);
  }
  if (this->heapBlockList ==
      (SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes> *)0x0) {
    this->heapBlockList = list;
    this->nextAllocableBlockHead = list;
  }
  else {
    this_00 = &HeapBlockList::
               Tail<Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>>
                         (this->heapBlockList)->
               super_SmallNormalHeapBlockT<MediumAllocationBlockAttributes>;
    if (this_00 == (SmallNormalHeapBlockT<MediumAllocationBlockAttributes> *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBucket.cpp"
                         ,0x738,"(tail != nullptr)","tail != nullptr");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
    }
    SmallNormalHeapBlockT<MediumAllocationBlockAttributes>::SetNextBlock
              (this_00,&list->super_SmallNormalHeapBlockT<MediumAllocationBlockAttributes>);
    if (this->nextAllocableBlockHead ==
        (SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes> *)0x0) {
      this->nextAllocableBlockHead = list;
    }
  }
  return;
}

Assistant:

void
HeapBucketT<TBlockType>::AppendAllocableHeapBlockList(TBlockType * list)
{
#ifdef RECYCLER_TRACE
    if (this->GetRecycler()->GetRecyclerFlagsTable().Trace.IsEnabled(Js::ConcurrentSweepPhase) && CONFIG_FLAG_RELEASE(Verbose))
    {
        CollectionState collectionState = this->GetRecycler()->collectionState;
        Output::Print(_u("[GC #%d] [HeapBucket 0x%p] in AppendAllocableHeapBlockList [CollectionState: %d] \n"), this->GetRecycler()->collectionCount, this, collectionState);
    }
#endif
    // Add the list to the end of the current list
    TBlockType * currentHeapBlockList = this->heapBlockList;
    if (currentHeapBlockList == nullptr)
    {
        // There weren't any heap block list before, just move the list over and start allocate from it
        this->heapBlockList = list;
        this->nextAllocableBlockHead = list;
    }
    else
    {
        // Find the last block and append the list
        TBlockType * tail = HeapBlockList::Tail(currentHeapBlockList);
        Assert(tail != nullptr);
        tail->SetNextBlock(list);

        // If we are not currently allocating from the existing heapBlockList,
        // that means fill all the exiting one already, we should start with what we just appended.
        if (this->nextAllocableBlockHead == nullptr)
        {
            this->nextAllocableBlockHead = list;
        }
    }
}